

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu_util.c
# Opt level: O0

aom_codec_err_t
read_obu_size(uint8_t *data,size_t bytes_available,size_t *obu_size,size_t *length_field_size)

{
  int iVar1;
  size_t *in_RCX;
  ulong *in_RDX;
  size_t in_RSI;
  uint8_t *in_RDI;
  uint64_t u_obu_size;
  uint64_t local_30 [2];
  ulong *local_20;
  aom_codec_err_t local_4;
  
  local_30[0] = 0;
  local_20 = in_RDX;
  iVar1 = aom_uleb_decode(in_RDI,in_RSI,local_30,in_RCX);
  if (iVar1 == 0) {
    if (local_30[0] < 0x100000000) {
      *local_20 = local_30[0];
      local_4 = AOM_CODEC_OK;
    }
    else {
      local_4 = AOM_CODEC_CORRUPT_FRAME;
    }
  }
  else {
    local_4 = AOM_CODEC_CORRUPT_FRAME;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t read_obu_size(const uint8_t *data,
                                     size_t bytes_available,
                                     size_t *const obu_size,
                                     size_t *const length_field_size) {
  uint64_t u_obu_size = 0;
  if (aom_uleb_decode(data, bytes_available, &u_obu_size, length_field_size) !=
      0) {
    return AOM_CODEC_CORRUPT_FRAME;
  }

  if (u_obu_size > UINT32_MAX) return AOM_CODEC_CORRUPT_FRAME;
  *obu_size = (size_t)u_obu_size;
  return AOM_CODEC_OK;
}